

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneofFields
          (MessageGenerator *this,Printer *p,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  pointer ppFVar1;
  pointer ppFVar2;
  OneofDescriptor *pOVar3;
  long lVar4;
  allocator<char> local_212;
  allocator<char> local_211;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 local_200 [8];
  undefined8 uStack_1f8;
  Printer *p_local;
  _Any_data local_1e8;
  code *local_1d8;
  code *pcStack_1d0;
  string local_1c0;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [8];
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  ppFVar1 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  p_local = p;
  if (ppFVar1 == ppFVar2) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/cpp/message.cc"
               ,0x1141,0xf,"!fields.empty()");
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_1a0);
  }
  if ((long)ppFVar2 - (long)ppFVar1 == 8) {
    GenerateSerializeOneField(this,p,*ppFVar1,-1);
    return;
  }
  pOVar3 = FieldDescriptor::containing_oneof(*ppFVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"name",&local_211);
  io::Printer::Sub::Sub<std::__cxx11::string_const&>
            (&local_1a0,&local_1c0,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(pOVar3 + 8));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_210,"cases",&local_212);
  local_e8 = local_d8;
  if (local_210 == local_200) {
    uStack_d0 = uStack_1f8;
  }
  else {
    local_e8 = local_210;
  }
  local_e0 = local_208;
  local_208 = 0;
  local_200[0] = 0;
  local_1d8 = (code *)0x0;
  pcStack_1d0 = (code *)0x0;
  local_1e8._M_unused._M_object = (void *)0x0;
  local_1e8._8_8_ = 0;
  local_210 = local_200;
  local_1e8._M_unused._M_object = operator_new(0x20);
  *(vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    **)local_1e8._M_unused._0_8_ = fields;
  *(Printer ***)((long)local_1e8._M_unused._0_8_ + 8) = &p_local;
  *(MessageGenerator **)((long)local_1e8._M_unused._0_8_ + 0x10) = this;
  *(code *)((long)local_1e8._M_unused._0_8_ + 0x18) = (code)0x0;
  pcStack_1d0 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                ::_M_invoke;
  local_1d8 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
              ::_M_manager;
  std::variant<std::__cxx11::string,std::function<bool()>>::
  variant<std::function<bool()>,void,void,std::function<bool()>,void>
            (local_c8,(function<bool_()> *)&local_1e8);
  std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  local_80 = 0;
  if (local_a8 == '\x01') {
    std::__cxx11::string::assign((char *)&local_a0);
  }
  local_38 = 0;
  google::protobuf::io::Printer::Emit
            (p,&local_1a0,2,0x89,
             "\n            switch (this_.$name$_case()) {\n              $cases$;\n              default:\n                break;\n            }\n          "
            );
  lVar4 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_1a0.key_._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0xb8;
  } while (lVar4 != -0xb8);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1c0);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneofFields(
    io::Printer* p, const std::vector<const FieldDescriptor*>& fields) {
  ABSL_CHECK(!fields.empty());
  if (fields.size() == 1) {
    GenerateSerializeOneField(p, fields[0], -1);
    return;
  }
  // We have multiple mutually exclusive choices.  Emit a switch statement.
  const OneofDescriptor* oneof = fields[0]->containing_oneof();
  p->Emit({{"name", oneof->name()},
           {"cases",
            [&] {
              for (const auto* field : fields) {
                p->Emit({{"Name", UnderscoresToCamelCase(field->name(), true)},
                         {"body",
                          [&] {
                            field_generators_.get(field)
                                .GenerateSerializeWithCachedSizesToArray(p);
                          }}},
                        R"cc(
                          case k$Name$: {
                            $body$;
                            break;
                          }
                        )cc");
              }
            }}},
          R"cc(
            switch (this_.$name$_case()) {
              $cases$;
              default:
                break;
            }
          )cc");
}